

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::CaseInsensitiveStringEquals<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s2)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = String::CaseInsensitiveCStringEquals((s1->_M_dataplus)._M_p,(s2->_M_dataplus)._M_p);
  if (bVar1) {
    lVar2 = std::__cxx11::string::find((char)s1,0);
    lVar3 = std::__cxx11::string::find((char)s2,0);
    if (lVar2 == -1 || lVar3 == -1) {
      bVar1 = lVar2 == lVar3;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)s1);
      std::__cxx11::string::substr((ulong)&bStack_68,(ulong)s2);
      bVar1 = CaseInsensitiveStringEquals<std::__cxx11::string>(&local_48,&bStack_68);
      std::__cxx11::string::~string((string *)&bStack_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CaseInsensitiveStringEquals(const StringType& s1,
                                 const StringType& s2) {
  // Are the heads equal?
  if (!CaseInsensitiveCStringEquals(s1.c_str(), s2.c_str())) {
    return false;
  }

  // Skip the equal heads.
  const typename StringType::value_type nul = 0;
  const size_t i1 = s1.find(nul), i2 = s2.find(nul);

  // Are we at the end of either s1 or s2?
  if (i1 == StringType::npos || i2 == StringType::npos) {
    return i1 == i2;
  }

  // Are the tails equal?
  return CaseInsensitiveStringEquals(s1.substr(i1 + 1), s2.substr(i2 + 1));
}